

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

void set_num_vaults(chunk_conflict *c)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t max;
  chunk_conflict *c_local;
  
  num_wild_vaults = L'\0';
  if (10 < c->depth) {
    uVar2 = Rand_div(2);
    num_wild_vaults = uVar2 + num_wild_vaults;
  }
  if (0x14 < c->depth) {
    uVar2 = Rand_div(2);
    num_wild_vaults = uVar2 + num_wild_vaults;
  }
  if (0x1e < c->depth) {
    uVar2 = Rand_div(2);
    num_wild_vaults = uVar2 + num_wild_vaults;
  }
  if (0x28 < c->depth) {
    uVar2 = Rand_div(2);
    num_wild_vaults = uVar2 + num_wild_vaults;
  }
  _Var1 = no_vault((int)player->place);
  if (_Var1) {
    num_wild_vaults = L'\0';
  }
  return;
}

Assistant:

static void set_num_vaults(struct chunk *c)
{
	int max = 2;
	num_wild_vaults = 0;

	if (c->depth > 10)
		num_wild_vaults += randint0(max);
	if (c->depth > 20)
		num_wild_vaults += randint0(max);
	if (c->depth > 30)
		num_wild_vaults += randint0(max);
	if (c->depth > 40)
		num_wild_vaults += randint0(max);

	if (no_vault(player->place))
		num_wild_vaults = 0;
}